

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderPrimitiveCounterRestartingPrimitive::drawFunction
          (GeometryShaderPrimitiveCounterRestartingPrimitive *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x568))
            ((this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.m_drawMode,
             (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
             m_numberOfVerticesPerOneInputPrimitive *
             (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
             m_numberOfDrawnPrimitives + this->m_numberOfRestarts,0x1405,0);
  return;
}

Assistant:

void GeometryShaderPrimitiveCounterRestartingPrimitive::drawFunction()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.drawElements(m_testConfiguration.m_drawMode, (m_testConfiguration.m_numberOfDrawnPrimitives *
														 m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive +
													 m_numberOfRestarts),
					GL_UNSIGNED_INT, 0 /* indices */);
}